

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool TwoBytesTest2<unsigned_int>(pfHash hash,int maxlen,bool drawDiagram)

{
  bool bVar1;
  byte in_DL;
  bool result;
  HashCallback<unsigned_int> c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  bool in_stack_0000006b;
  bool in_stack_0000006c;
  bool in_stack_0000006d;
  bool in_stack_0000006e;
  bool in_stack_0000006f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000070;
  KeyCallback *in_stack_000000c8;
  int in_stack_000000d4;
  hashvec *hashes_00;
  undefined4 in_stack_ffffffffffffffa8;
  byte bVar2;
  undefined4 in_stack_ffffffffffffffac;
  HashCallback<unsigned_int> *in_stack_ffffffffffffffb0;
  hashvec local_28;
  byte local_d;
  
  local_d = in_DL & 1;
  hashes_00 = &local_28;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x130864);
  HashCallback<unsigned_int>::HashCallback
            (in_stack_ffffffffffffffb0,
             (pfHash)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),hashes_00);
  TwoBytesKeygen(in_stack_000000d4,in_stack_000000c8);
  bVar2 = 1;
  bVar1 = TestHashList<unsigned_int>
                    (in_stack_00000070,in_stack_0000006f,in_stack_0000006e,in_stack_0000006d,
                     in_stack_0000006c,in_stack_0000006b);
  bVar2 = bVar1 & bVar2;
  printf("\n");
  HashCallback<unsigned_int>::~HashCallback((HashCallback<unsigned_int> *)0x1308ec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffb0);
  return (bool)(bVar2 & 1);
}

Assistant:

bool TwoBytesTest2 ( pfHash hash, int maxlen, bool drawDiagram )
{
  std::vector<hashtype> hashes;

  HashCallback<hashtype> c(hash,hashes);

  TwoBytesKeygen(maxlen,c);

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  return result;
}